

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.cpp
# Opt level: O3

string * __thiscall
pbrt::TrowbridgeReitzDistribution::ToString_abi_cxx11_
          (string *__return_storage_ptr__,TrowbridgeReitzDistribution *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<float_const&,float_const&>
            (__return_storage_ptr__,"[ TrowbridgeReitzDistribution alpha_x: %f alpha_y: %f ]",
             &this->alpha_x,&this->alpha_y);
  return __return_storage_ptr__;
}

Assistant:

std::string TrowbridgeReitzDistribution::ToString() const {
    return StringPrintf("[ TrowbridgeReitzDistribution alpha_x: %f alpha_y: %f ]",
                        alpha_x, alpha_y);
}